

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int ptrmapGet(BtShared *pBt,Pgno key,u8 *pEType,Pgno *pPgno)

{
  Pgno pgno;
  int iVar1;
  u32 uVar2;
  void *pvVar3;
  int rc;
  int offset;
  u8 *pPtrmap;
  DbPage *pDStack_38;
  int iPtrmap;
  DbPage *pDbPage;
  Pgno *pPgno_local;
  u8 *pEType_local;
  BtShared *pBStack_18;
  Pgno key_local;
  BtShared *pBt_local;
  
  pDbPage = (DbPage *)pPgno;
  pPgno_local = (Pgno *)pEType;
  pEType_local._4_4_ = key;
  pBStack_18 = pBt;
  pgno = ptrmapPageno(pBt,key);
  pBt_local._4_4_ = sqlite3PagerGet(pBStack_18->pPager,pgno,&stack0xffffffffffffffc8,0);
  if (pBt_local._4_4_ == 0) {
    pvVar3 = sqlite3PagerGetData(pDStack_38);
    iVar1 = ((pEType_local._4_4_ - pgno) + -1) * 5;
    if (iVar1 < 0) {
      sqlite3PagerUnref(pDStack_38);
      pBt_local._4_4_ = sqlite3CorruptError(0xfb38);
    }
    else {
      *(undefined1 *)pPgno_local = *(undefined1 *)((long)pvVar3 + (long)iVar1);
      if (pDbPage != (DbPage *)0x0) {
        uVar2 = sqlite3Get4byte((u8 *)((long)pvVar3 + (long)(iVar1 + 1)));
        *(u32 *)&pDbPage->pPage = uVar2;
      }
      sqlite3PagerUnref(pDStack_38);
      if (((char)*pPgno_local == '\0') || (5 < (byte)*pPgno_local)) {
        pBt_local._4_4_ = sqlite3CorruptError(0xfb40);
      }
      else {
        pBt_local._4_4_ = 0;
      }
    }
  }
  return pBt_local._4_4_;
}

Assistant:

static int ptrmapGet(BtShared *pBt, Pgno key, u8 *pEType, Pgno *pPgno){
  DbPage *pDbPage;   /* The pointer map page */
  int iPtrmap;       /* Pointer map page index */
  u8 *pPtrmap;       /* Pointer map page data */
  int offset;        /* Offset of entry in pointer map */
  int rc;

  assert( sqlite3_mutex_held(pBt->mutex) );

  iPtrmap = PTRMAP_PAGENO(pBt, key);
  rc = sqlite3PagerGet(pBt->pPager, iPtrmap, &pDbPage, 0);
  if( rc!=0 ){
    return rc;
  }
  pPtrmap = (u8 *)sqlite3PagerGetData(pDbPage);

  offset = PTRMAP_PTROFFSET(iPtrmap, key);
  if( offset<0 ){
    sqlite3PagerUnref(pDbPage);
    return SQLITE_CORRUPT_BKPT;
  }
  assert( offset <= (int)pBt->usableSize-5 );
  assert( pEType!=0 );
  *pEType = pPtrmap[offset];
  if( pPgno ) *pPgno = get4byte(&pPtrmap[offset+1]);

  sqlite3PagerUnref(pDbPage);
  if( *pEType<1 || *pEType>5 ) return SQLITE_CORRUPT_PGNO(iPtrmap);
  return SQLITE_OK;
}